

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall
DBaseStatusBar::GetCurrentAmmo
          (DBaseStatusBar *this,AAmmo **ammo1,AAmmo **ammo2,int *ammocount1,int *ammocount2)

{
  AWeapon *pAVar1;
  int iVar2;
  AAmmo *pAVar3;
  AAmmo **ppAVar4;
  int iVar5;
  
  pAVar1 = this->CPlayer->ReadyWeapon;
  if (pAVar1 == (AWeapon *)0x0) {
    *ammo2 = (AAmmo *)0x0;
    ppAVar4 = ammo1;
  }
  else {
    pAVar3 = (pAVar1->Ammo1).field_0.p;
    if ((pAVar3 != (AAmmo *)0x0) &&
       (((pAVar3->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) !=
        0)) {
      (pAVar1->Ammo1).field_0.p = (AAmmo *)0x0;
      pAVar3 = (AAmmo *)0x0;
    }
    *ammo1 = pAVar3;
    pAVar1 = this->CPlayer->ReadyWeapon;
    pAVar3 = (pAVar1->Ammo2).field_0.p;
    if ((pAVar3 != (AAmmo *)0x0) &&
       (((pAVar3->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) !=
        0)) {
      (pAVar1->Ammo2).field_0.p = (AAmmo *)0x0;
      pAVar3 = (AAmmo *)0x0;
    }
    *ammo2 = pAVar3;
    if (*ammo1 != (AAmmo *)0x0) goto LAB_0060852c;
    *ammo1 = pAVar3;
    ppAVar4 = ammo2;
  }
  *ppAVar4 = (AAmmo *)0x0;
LAB_0060852c:
  iVar2 = 0;
  iVar5 = 0;
  if (*ammo1 != (AAmmo *)0x0) {
    iVar5 = ((*ammo1)->super_AInventory).Amount;
  }
  *ammocount1 = iVar5;
  if (*ammo2 != (AAmmo *)0x0) {
    iVar2 = ((*ammo2)->super_AInventory).Amount;
  }
  *ammocount2 = iVar2;
  return;
}

Assistant:

void DBaseStatusBar::GetCurrentAmmo (AAmmo *&ammo1, AAmmo *&ammo2, int &ammocount1, int &ammocount2) const
{
	if (CPlayer->ReadyWeapon != NULL)
	{
		ammo1 = CPlayer->ReadyWeapon->Ammo1;
		ammo2 = CPlayer->ReadyWeapon->Ammo2;
		if (ammo1 == NULL)
		{
			ammo1 = ammo2;
			ammo2 = NULL;
		}
	}
	else
	{
		ammo1 = ammo2 = NULL;
	}
	ammocount1 = ammo1 != NULL ? ammo1->Amount : 0;
	ammocount2 = ammo2 != NULL ? ammo2->Amount : 0;
}